

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O3

int __thiscall
f8n::runtime::MessageQueue::Remove(MessageQueue *this,IMessageTarget *target,int type)

{
  size_t *psVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  IMessageTarget *pIVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  LockT lock;
  int local_4c;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->queueMutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  p_Var5 = (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 == (_List_node_base *)&this->queue) {
    local_4c = 0;
  }
  else {
    local_4c = 0;
    do {
      plVar2 = (long *)(p_Var5[1]._M_next)->_M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var5[1]._M_next)->_M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pIVar4 = (IMessageTarget *)(**(code **)(*plVar2 + 0x10))(plVar2);
      if ((pIVar4 == target) &&
         ((type == -1 || (iVar3 = (**(code **)(*plVar2 + 0x18))(plVar2), iVar3 == type)))) {
        p_Var6 = p_Var5[1]._M_next;
        if ((p_Var6 != (_List_node_base *)0x0) &&
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6->_M_prev !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6->_M_prev);
        }
        operator_delete(p_Var6,0x18);
        p_Var6 = p_Var5->_M_next;
        psVar1 = &(this->queue).
                  super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var5,0x18);
        local_4c = local_4c + 1;
      }
      else {
        p_Var6 = p_Var5->_M_next;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      p_Var5 = p_Var6;
    } while (p_Var6 != (_List_node_base *)&this->queue);
  }
  if ((this->queue).
      super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
      ._M_impl._M_node._M_size != 0) {
    LOCK();
    (this->nextMessageTime).super___atomic_base<long>._M_i =
         (__int_type)
         (this->queue).
         super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next;
    UNLOCK();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return local_4c;
}

Assistant:

int MessageQueue::Remove(IMessageTarget *target, int type) {
    LockT lock(this->queueMutex);

    int count = 0;
    std::list<EnqueuedMessage*>::iterator it = this->queue.begin();
    while (it != this->queue.end()) {
        IMessagePtr current = (*it)->message;

        if (current->Target() == target) {
            if (type == -1 || type == current->Type()) {
                delete (*it);
                it = this->queue.erase(it);
                ++count;
                continue;
            }
        }

        ++it;
    }

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }

    return count;
}